

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::AsyncCapabilityStream::ReadResult,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>
::reject(AdapterPromiseNode<kj::AsyncCapabilityStream::ReadResult,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>
         *this,Exception *exception)

{
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult> EStack_1c8;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&EStack_1c8,exception);
    EStack_1c8.value.ptr.isSet = false;
    ExceptionOr<kj::AsyncCapabilityStream::ReadResult>::operator=(&this->result,&EStack_1c8);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&EStack_1c8);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }